

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_add(sexp ctx,sexp a,sexp b)

{
  double dVar1;
  sexp b_00;
  sexp psVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  double local_38;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  if (((ulong)a & 3) == 0) {
    uVar4 = 0;
    if ((ulong)a->tag < 0x11) {
      uVar4 = sexp_number_types[a->tag];
    }
  }
  else {
    uVar4 = (uint)a & 1;
  }
  if (((ulong)b & 3) == 0) {
    uVar6 = 0;
    if ((ulong)b->tag < 0x11) {
      uVar6 = sexp_number_types[b->tag];
    }
  }
  else {
    uVar6 = (uint)b & 1;
  }
  local_28.var = &local_30;
  local_30 = (sexp)&DAT_0000043e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  psVar2 = a;
  b_00 = b;
  uVar5 = uVar4;
  if ((int)uVar4 <= (int)uVar6) {
    psVar2 = (sexp)&DAT_0000043e;
    b_00 = a;
    a = b;
    uVar5 = uVar6;
    uVar6 = uVar4;
  }
  uVar5 = uVar5 + uVar6 * 6;
  if (0x23 < uVar5) goto switchD_0011b33c_caseD_6;
  switch(uVar5) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
    psVar2 = sexp_type_exception(ctx,(sexp)0x0,3,b_00);
    break;
  case 7:
    lVar3 = ((long)a >> 1) + ((long)b_00 >> 1);
    if (lVar3 + -0x4000000000000000 < 0) {
      psVar2 = (sexp)(lVar3 * 2 + 1);
    }
    else {
      local_30 = sexp_fixnum_to_bignum(ctx,b_00);
      psVar2 = sexp_add(ctx,local_30,a);
    }
    break;
  case 8:
    psVar2 = a;
    if (b_00 == (sexp)&DAT_00000001) break;
    local_38 = (double)((long)b_00 >> 1);
    goto LAB_0011b42c;
  case 9:
    psVar2 = sexp_bignum_add_fixnum(ctx,a,b_00);
    goto LAB_0011b441;
  case 10:
  case 0x16:
    b_00 = sexp_make_ratio(ctx,b_00,(sexp)&DAT_00000003);
    local_30 = b_00;
  case 0x1c:
    psVar2 = sexp_ratio_add(ctx,b_00,a);
    break;
  case 0xb:
  case 0x11:
  case 0x17:
  case 0x1d:
    b_00 = sexp_make_complex(ctx,b_00,(sexp)&DAT_00000001);
    local_30 = b_00;
  case 0x23:
    psVar2 = sexp_complex_add(ctx,b_00,a);
    break;
  case 0xe:
    local_38 = (b_00->value).flonum;
LAB_0011b42c:
    local_38 = local_38 + (a->value).flonum;
LAB_0011b462:
    psVar2 = sexp_make_flonum(ctx,local_38);
    break;
  case 0xf:
    local_38 = (b_00->value).flonum;
    dVar1 = sexp_bignum_to_double(a);
    uVar7 = SUB84(dVar1,0);
    uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
    goto LAB_0011b45d;
  case 0x10:
    local_38 = (b_00->value).flonum;
    dVar1 = sexp_ratio_to_double(ctx,a);
    uVar7 = SUB84(dVar1,0);
    uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
LAB_0011b45d:
    local_38 = (double)CONCAT44(uVar8,uVar7) + local_38;
    goto LAB_0011b462;
  case 0x15:
    psVar2 = sexp_bignum_add(ctx,(sexp)0x0,a,b_00);
LAB_0011b441:
    psVar2 = sexp_bignum_normalize(psVar2);
  }
switchD_0011b33c_caseD_6:
  (ctx->value).context.saves = local_28.next;
  return psVar2;
}

Assistant:

sexp sexp_add (sexp ctx, sexp a, sexp b) {
  sexp_sint_t sum;
  int at=sexp_number_type(a), bt=sexp_number_type(b), t;
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {r=a; a=b; b=r; t=at; at=bt; bt=t;}
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_NOT_CPX:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_FIX:
    sum = sexp_unbox_fixnum(a) + sexp_unbox_fixnum(b);
    if ((sum < SEXP_MIN_FIXNUM) || (sum > SEXP_MAX_FIXNUM))
      r = sexp_add(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    else
      r = sexp_make_fixnum(sum);
    break;
  case SEXP_NUM_FIX_FLO:
    r = a == SEXP_ZERO ? b : sexp_make_flonum(ctx, sexp_fixnum_to_double(a)+sexp_flonum_value(b));
    break;
  case SEXP_NUM_FIX_BIG:
    r = sexp_bignum_normalize(sexp_bignum_add_fixnum(ctx, b, a));
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_add(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) + sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_add(ctx, NULL, b, a));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) + sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_add(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_add(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}